

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_ror_cc_aarch64(CPUARMState_conflict *env,uint32_t x,uint32_t i)

{
  sbyte sVar1;
  int shift;
  int shift1;
  uint32_t i_local;
  uint32_t x_local;
  CPUARMState_conflict *env_local;
  
  if ((i & 0x1f) == 0) {
    env_local._4_4_ = x;
    if ((i & 0xff) != 0) {
      env->CF = x >> 0x1f;
    }
  }
  else {
    sVar1 = (sbyte)(i & 0x1f);
    env->CF = x >> (sVar1 - 1U & 0x1f) & 1;
    env_local._4_4_ = x >> sVar1 | x << (0x20U - sVar1 & 0x1f);
  }
  return env_local._4_4_;
}

Assistant:

uint32_t HELPER(ror_cc)(CPUARMState *env, uint32_t x, uint32_t i)
{
    int shift1, shift;
    shift1 = i & 0xff;
    shift = shift1 & 0x1f;
    if (shift == 0) {
        if (shift1 != 0)
            env->CF = (x >> 31) & 1;
        return x;
    } else {
        env->CF = (x >> (shift - 1)) & 1;
        return ((uint32_t)x >> shift) | (x << (32 - shift));
    }
}